

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

void __thiscall ON_MappingMeshInfo::GenerateDerivedData(ON_MappingMeshInfo *this)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  int nTotal;
  int local_30 [2];
  
  piVar4 = (this->m_sourceIdFaceStart).m_a;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,(long)(this->m_sourceIdFaceStart).m_capacity << 2);
  }
  (this->m_sourceIdFaceStart).m_count = 0;
  piVar4 = (this->m_sourceIdFaceCount).m_a;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,(long)(this->m_sourceIdFaceCount).m_capacity << 2);
  }
  (this->m_sourceIdFaceCount).m_count = 0;
  piVar4 = (this->m_sourceIdFaceList).m_a;
  if (piVar4 != (int *)0x0) {
    memset(piVar4,0,(long)(this->m_sourceIdFaceList).m_capacity << 2);
  }
  (this->m_sourceIdFaceList).m_count = 0;
  if (0 < (this->m_faceSourceIds).m_count) {
    lVar9 = 0;
    do {
      iVar2 = (this->m_faceSourceIds).m_a[lVar9];
      if (-1 < (long)iVar2) {
        while ((this->m_sourceIdFaceCount).m_count <= iVar2) {
          local_30[1] = 0;
          ON_SimpleArray<int>::Append(&this->m_sourceIdFaceCount,local_30 + 1);
        }
        piVar4 = (this->m_sourceIdFaceCount).m_a + iVar2;
        *piVar4 = *piVar4 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->m_faceSourceIds).m_count);
  }
  local_30[0] = 0;
  if (0 < (this->m_sourceIdFaceCount).m_count) {
    lVar9 = 0;
    do {
      ON_SimpleArray<int>::Append(&this->m_sourceIdFaceStart,local_30);
      local_30[0] = local_30[0] + (this->m_sourceIdFaceCount).m_a[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->m_sourceIdFaceCount).m_count);
  }
  ON_SimpleArray<int>::SetCapacity(&this->m_sourceIdFaceList,(long)local_30[0]);
  uVar3 = (this->m_sourceIdFaceList).m_capacity;
  if (local_30[0] <= (int)uVar3 && -1 < local_30[0]) {
    (this->m_sourceIdFaceList).m_count = local_30[0];
  }
  piVar4 = (this->m_sourceIdFaceList).m_a;
  if (0 < (int)uVar3 && piVar4 != (int *)0x0) {
    memset(piVar4,0,(ulong)uVar3 << 2);
  }
  piVar4 = (this->m_sourceIdFaceCount).m_a;
  if ((piVar4 != (int *)0x0) && (lVar9 = (long)(this->m_sourceIdFaceCount).m_capacity, 0 < lVar9)) {
    memset(piVar4,0,lVar9 << 2);
  }
  if (0 < (this->m_faceSourceIds).m_count) {
    piVar4 = (this->m_faceSourceIds).m_a;
    piVar5 = (this->m_sourceIdFaceStart).m_a;
    piVar6 = (this->m_sourceIdFaceCount).m_a;
    piVar7 = (this->m_sourceIdFaceList).m_a;
    lVar9 = 0;
    do {
      lVar8 = (long)piVar4[lVar9];
      if (-1 < lVar8) {
        piVar7[(long)piVar6[lVar8] + (long)piVar5[lVar8]] = (int)lVar9;
        piVar1 = piVar6 + lVar8;
        *piVar1 = *piVar1 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->m_faceSourceIds).m_count);
  }
  return;
}

Assistant:

void ON_MappingMeshInfo::GenerateDerivedData()
{
  m_sourceIdFaceStart.Empty();
  m_sourceIdFaceCount.Empty();
  m_sourceIdFaceList.Empty();
  for (int fi = 0; fi < m_faceSourceIds.Count(); fi++)
  {
    const int sourceId = m_faceSourceIds[fi];
    if (sourceId >= 0)
    {
      while (m_sourceIdFaceCount.Count() <= sourceId)
      {
        m_sourceIdFaceCount.Append(0);
      }
      m_sourceIdFaceCount[sourceId]++;
    }
  }
  int nTotal = 0;
  for (int sid = 0; sid < m_sourceIdFaceCount.Count(); sid++)
  {
    m_sourceIdFaceStart.Append(nTotal);
    nTotal += m_sourceIdFaceCount[sid];
  }
  m_sourceIdFaceList.SetCapacity(nTotal);
  m_sourceIdFaceList.SetCount(nTotal);
  m_sourceIdFaceList.MemSet(0);
  m_sourceIdFaceCount.MemSet(0);
  for (int fi = 0; fi < m_faceSourceIds.Count(); fi++)
  {
    const int sourceId = m_faceSourceIds[fi];
    if (sourceId >= 0)
    {
      m_sourceIdFaceList[m_sourceIdFaceStart[sourceId] + m_sourceIdFaceCount[sourceId]] = fi;
      m_sourceIdFaceCount[sourceId]++;
    }
  }
}